

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupSimpleDfsPart(Aig_Man_t *p,Vec_Ptr_t *vPis,Vec_Ptr_t *vPos)

{
  int iVar1;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  int local_3c;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vPos_local;
  Vec_Ptr_t *vPis_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  Aig_ManCleanData(p);
  pAVar2 = Aig_ManConst1(p_00);
  pAVar3 = Aig_ManConst1(p);
  (pAVar3->field_5).pData = pAVar2;
  for (local_3c = 0; iVar1 = Vec_PtrSize(vPis), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar4 = Vec_PtrEntry(vPis,local_3c);
    pAVar2 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar2;
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(vPos), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vPos,local_3c);
    pAVar3 = Aig_ObjFanin0(pAVar2);
    pAVar3 = Aig_ManDupSimpleDfs_rec(p_00,p,pAVar3);
    iVar1 = Aig_ObjFaninC0(pAVar2);
    pAVar2 = Aig_NotCond(pAVar3,iVar1);
    Aig_ObjCreateCo(p_00,pAVar2);
  }
  Aig_ManSetRegNum(p_00,0);
  iVar1 = Aig_ManCheck(p_00);
  if (iVar1 == 0) {
    printf("Aig_ManDupSimple(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupSimpleDfsPart( Aig_Man_t * p, Vec_Ptr_t * vPis, Vec_Ptr_t * vPos )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1( pNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, vPis, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // duplicate internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vPos, pObj, i )
    {
        pObjNew = Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );        
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
        Aig_ObjCreateCo( pNew, pObjNew );
    }
    Aig_ManSetRegNum( pNew, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}